

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comments.cpp
# Opt level: O0

void __thiscall
Comments_CommentsCannotContainControlCharacters_Test::TestBody
          (Comments_CommentsCannotContainControlCharacters_Test *this)

{
  AssertionResult gtest_ar;
  parser_error_t *e;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined1 local_1e0 [8];
  events_aggregator_t handler;
  allocator local_1b1;
  string local_1b0 [32];
  istringstream local_190 [8];
  istringstream input;
  Comments_CommentsCannotContainControlCharacters_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b0,"# this comment ends here -->\b and after that will be an error",&local_1b1);
  std::__cxx11::istringstream::istringstream(local_190,local_1b0,8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  events_aggregator_t::events_aggregator_t((events_aggregator_t *)local_1e0);
  loltoml::v_0_1_1::parse<events_aggregator_t>
            ((istream *)local_190,(events_aggregator_t *)local_1e0);
  testing::Message::Message(&local_1e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1f0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/comments.cpp"
             ,0x2c,"Failed");
  testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
  testing::internal::AssertHelper::~AssertHelper(&local_1f0);
  testing::Message::~Message(&local_1e8);
  events_aggregator_t::~events_aggregator_t((events_aggregator_t *)local_1e0);
  std::__cxx11::istringstream::~istringstream(local_190);
  return;
}

Assistant:

TEST(Comments, CommentsCannotContainControlCharacters) {
    std::istringstream input("# this comment ends here -->\b and after that will be an error");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(28, e.offset());
    }
}